

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumDefinition
          (Parser *this,EnumDescriptorProto *enum_type,SymbolVisibility *visibility,
          LocationRecorder *enum_location,FileDescriptorProto *containing_file)

{
  SymbolVisibility value;
  bool bVar1;
  string *output;
  Arena *arena;
  string_view text;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  text._M_str = "enum";
  text._M_len = 4;
  bVar1 = Consume(this,text);
  if (bVar1) {
    LocationRecorder::Init(&LStack_48,enum_location,enum_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_48.location_)->field_0)._impl_.path_,1);
    LocationRecorder::RecordLegacyLocation(&LStack_48,&enum_type->super_Message,NAME);
    *(byte *)&enum_type->field_0 = *(byte *)&enum_type->field_0 | 1;
    arena = (Arena *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    output = protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                       (&(enum_type->field_0)._impl_.name_,arena);
    bVar1 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x65d3dc));
    LocationRecorder::~LocationRecorder(&LStack_48);
    if (((bVar1) && (bVar1 = ParseEnumBlock(this,enum_type,enum_location,containing_file), bVar1))
       && (bVar1 = ValidateEnum(this,enum_type), bVar1)) {
      value = *visibility;
      if (value == VISIBILITY_UNSET) {
        return true;
      }
      bVar1 = protobuf::internal::ValidateEnum(value,(uint32_t *)&SymbolVisibility_internal_data_);
      if (bVar1) {
        (enum_type->field_0)._impl_.visibility_ = value;
        *(byte *)&enum_type->field_0 = *(byte *)&enum_type->field_0 | 4;
        return true;
      }
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::SymbolVisibility_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x3e55,
                    "void google::protobuf::EnumDescriptorProto::_internal_set_visibility(::google::protobuf::SymbolVisibility)"
                   );
    }
  }
  return false;
}

Assistant:

bool Parser::ParseEnumDefinition(EnumDescriptorProto* enum_type,
                                 const SymbolVisibility& visibility,
                                 const LocationRecorder& enum_location,
                                 const FileDescriptorProto* containing_file) {
  DO(Consume("enum"));

  {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(enum_type,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(enum_type->mutable_name(), "Expected enum name."));
  }

  DO(ParseEnumBlock(enum_type, enum_location, containing_file));

  DO(ValidateEnum(enum_type));

  if (visibility != SymbolVisibility::VISIBILITY_UNSET) {
    enum_type->set_visibility(visibility);
  }

  return true;
}